

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::block_number_limits
               (NegativeTestContext *ctx)

{
  uint glShaderType;
  bool bVar1;
  ShaderType shaderType;
  int iVar2;
  ProgramSources *pPVar3;
  GLenum in_ECX;
  long lVar4;
  GLenum in_R8D;
  string source;
  string fragSource;
  string vertSource;
  string tessEvalSource;
  string tessControlSource;
  ProgramSources sources;
  undefined1 local_310 [40];
  undefined1 local_2e8 [40];
  string local_2c0;
  undefined1 local_2a0 [40];
  string local_278;
  string local_258;
  undefined1 local_238 [40];
  string local_210;
  string local_1f0;
  ProgramSources local_1d0;
  ProgramSources local_100;
  
  NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
            (&local_258,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8b31,in_ECX);
  NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
            (&local_278,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8b30,in_ECX);
  NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8e88,in_ECX);
  NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8e87,in_ECX);
  lVar4 = 0;
  do {
    if (lVar4 == 0x18) {
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"maxShaderStorageBlocks: Exceed limits",
               (allocator<char> *)local_2e8);
    NegativeTestContext::beginSection(ctx,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    glShaderType = *(uint *)((long)&DAT_018e09c0 + lVar4);
    shaderType = getGLUShaderType(glShaderType);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      iVar2 = getMaxSSBlockSize(ctx,glShaderType);
      NegativeTestShared::(anonymous_namespace)::genBlockSource_abi_cxx11_
                (&local_2c0,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(long)(iVar2 + 1),
                 (ulong)glShaderType,in_R8D);
      memset(&local_1d0,0,0xac);
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_1d0._193_8_ = 0;
      if (iVar2 != 0) {
        if (glShaderType == 0x8b30) {
          glu::VertexSource::VertexSource((VertexSource *)local_2e8,&local_258);
          pPVar3 = glu::ProgramSources::operator<<(&local_1d0,(ShaderSource *)local_2e8);
          glu::FragmentSource::FragmentSource((FragmentSource *)local_310,&local_2c0);
          glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_310);
LAB_013ad4bf:
          std::__cxx11::string::~string((string *)(local_310 + 8));
LAB_013ad4c9:
          std::__cxx11::string::~string((string *)(local_2e8 + 8));
        }
        else {
          if (glShaderType == 0x91b9) {
            glu::ComputeSource::ComputeSource((ComputeSource *)local_2e8,&local_2c0);
            glu::ProgramSources::operator<<(&local_1d0,(ShaderSource *)local_2e8);
            goto LAB_013ad4c9;
          }
          if (glShaderType == 0x8dd9) {
            glu::VertexSource::VertexSource((VertexSource *)local_2e8,&local_258);
            pPVar3 = glu::ProgramSources::operator<<(&local_1d0,(ShaderSource *)local_2e8);
            glu::FragmentSource::FragmentSource((FragmentSource *)local_310,&local_278);
            pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_310);
            glu::GeometrySource::GeometrySource((GeometrySource *)local_2a0,&local_2c0);
            glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_2a0);
LAB_013ad45b:
            std::__cxx11::string::~string((string *)(local_2a0 + 8));
            goto LAB_013ad4bf;
          }
          if (glShaderType == 0x8e87) {
            glu::VertexSource::VertexSource((VertexSource *)local_2e8,&local_258);
            pPVar3 = glu::ProgramSources::operator<<(&local_1d0,(ShaderSource *)local_2e8);
            glu::FragmentSource::FragmentSource((FragmentSource *)local_310,&local_278);
            pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_310);
            glu::TessellationControlSource::TessellationControlSource
                      ((TessellationControlSource *)local_2a0,&local_1f0);
            pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_2a0);
            glu::TessellationEvaluationSource::TessellationEvaluationSource
                      ((TessellationEvaluationSource *)local_238,&local_2c0);
            glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_238);
LAB_013ad44e:
            std::__cxx11::string::~string((string *)(local_238 + 8));
            goto LAB_013ad45b;
          }
          if (glShaderType == 0x8e88) {
            glu::VertexSource::VertexSource((VertexSource *)local_2e8,&local_258);
            pPVar3 = glu::ProgramSources::operator<<(&local_1d0,(ShaderSource *)local_2e8);
            glu::FragmentSource::FragmentSource((FragmentSource *)local_310,&local_278);
            pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_310);
            glu::TessellationControlSource::TessellationControlSource
                      ((TessellationControlSource *)local_2a0,&local_2c0);
            pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_2a0);
            glu::TessellationEvaluationSource::TessellationEvaluationSource
                      ((TessellationEvaluationSource *)local_238,&local_210);
            glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_238);
            goto LAB_013ad44e;
          }
          if (glShaderType == 0x8b31) {
            glu::VertexSource::VertexSource((VertexSource *)local_2e8,&local_2c0);
            pPVar3 = glu::ProgramSources::operator<<(&local_1d0,(ShaderSource *)local_2e8);
            glu::FragmentSource::FragmentSource((FragmentSource *)local_310,&local_278);
            glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_310);
            goto LAB_013ad4bf;
          }
        }
        glu::ProgramSources::ProgramSources(&local_100,&local_1d0);
        verifyProgram(ctx,&local_100);
        glu::ProgramSources::~ProgramSources(&local_100);
      }
      NegativeTestContext::endSection(ctx);
      glu::ProgramSources::~ProgramSources(&local_1d0);
      std::__cxx11::string::~string((string *)&local_2c0);
    }
    else {
      NegativeTestContext::endSection(ctx);
    }
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

void block_number_limits (NegativeTestContext& ctx)
{
	const glw::GLenum glShaderTypes[] =
	{
		GL_VERTEX_SHADER,
		GL_FRAGMENT_SHADER,
		GL_TESS_CONTROL_SHADER,
		GL_TESS_EVALUATION_SHADER,
		GL_GEOMETRY_SHADER,
		GL_COMPUTE_SHADER,
	};

	const std::string	vertSource			= genCommonSource(ctx, GL_VERTEX_SHADER);
	const std::string	fragSource			= genCommonSource(ctx, GL_FRAGMENT_SHADER);
	const std::string	tessControlSource	= genCommonSource(ctx, GL_TESS_CONTROL_SHADER);
	const std::string	tessEvalSource		= genCommonSource(ctx, GL_TESS_EVALUATION_SHADER);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(glShaderTypes); ndx++)
	{
		ctx.beginSection("maxShaderStorageBlocks: Exceed limits");

		if (!ctx.isShaderSupported(static_cast<glu::ShaderType>(getGLUShaderType(glShaderTypes[ndx]))))
		{
			ctx.endSection();
			continue;
		}

		int					maxSSBlocks			= getMaxSSBlockSize(ctx, glShaderTypes[ndx]);
		std::string			source				= genBlockSource(ctx, maxSSBlocks+1, glShaderTypes[ndx]);

		glu::ProgramSources sources;

		if (maxSSBlocks == 0)
		{
			ctx.endSection();
			continue;
		}

		switch (glShaderTypes[ndx])
		{
			case GL_VERTEX_SHADER:
				sources << glu::VertexSource(source)
						<< glu::FragmentSource(fragSource);
				break;

			case GL_FRAGMENT_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(source);
				break;

			case GL_TESS_CONTROL_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(fragSource)
						<< glu::TessellationControlSource(source)
						<< glu::TessellationEvaluationSource(tessEvalSource);
				break;

			case GL_TESS_EVALUATION_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(fragSource)
						<< glu::TessellationControlSource(tessControlSource)
						<< glu::TessellationEvaluationSource(source);
				break;

			case GL_GEOMETRY_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(fragSource)
						<< glu::GeometrySource(source);
				break;

			case GL_COMPUTE_SHADER:
				sources << glu::ComputeSource(source);
				break;

			default:
				DE_FATAL("Unknown shader type");
				break;
		}

		verifyProgram(ctx, sources);
		ctx.endSection();
	}
}